

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseOperatorName(State *state,int *arity)

{
  ParseState *pPVar1;
  undefined1 *puVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  bool bVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  char *str;
  char *pcVar20;
  char *pcVar21;
  undefined8 *puVar22;
  
  iVar5 = state->recursion_depth;
  iVar6 = state->steps;
  state->recursion_depth = iVar5 + 1;
  state->steps = iVar6 + 1;
  if (iVar6 < 0x20000 && iVar5 < 0x100) {
    lVar17 = (long)(state->parse_state).mangled_idx;
    if (state->mangled_begin[lVar17] != '\0') {
      pPVar1 = &state->parse_state;
      lVar18 = -1;
      do {
        if (lVar18 == 0) {
          lVar19 = 1;
          break;
        }
        lVar19 = lVar18 + 1;
        lVar11 = lVar18 + lVar17 + 2;
        lVar18 = lVar19;
      } while (state->mangled_begin[lVar11] != '\0');
      if (lVar19 != 0) {
        iVar5 = (state->parse_state).prev_name_idx;
        uVar9 = pPVar1->mangled_idx;
        uVar10 = pPVar1->out_cur_idx;
        uVar7 = *(uint *)&(state->parse_state).field_0xc;
        bVar15 = ParseTwoCharToken(state,"cv");
        if (bVar15) {
          MaybeAppend(state,"operator ");
          puVar2 = &(state->parse_state).field_0xc;
          *(uint *)puVar2 = *(uint *)puVar2 & 0x8000ffff;
          iVar6 = state->recursion_depth;
          iVar8 = state->steps;
          state->recursion_depth = iVar6 + 1;
          state->steps = iVar8 + 1;
          if (iVar8 < 0x20000 && iVar6 < 0x100) {
            iVar8 = pPVar1->mangled_idx;
            iVar12 = pPVar1->out_cur_idx;
            iVar13 = (state->parse_state).prev_name_idx;
            uVar14 = *(undefined4 *)&(state->parse_state).field_0xc;
            pcVar20 = state->mangled_begin;
            iVar6 = (state->parse_state).mangled_idx;
            do {
              bVar15 = ParseCharClass(state,"OPRCGrVK");
            } while (bVar15);
            pcVar21 = state->mangled_begin + (state->parse_state).mangled_idx;
            bVar15 = ParseType(state);
            if (bVar15) {
              for (; pcVar20 + iVar6 != pcVar21; pcVar21 = pcVar21 + -1) {
                bVar4 = pcVar21[-1];
                if (bVar4 < 0x4b) {
                  if (bVar4 == 0x43) {
                    str = " _Complex";
                  }
                  else {
                    if (bVar4 != 0x47) goto switchD_00275e80_caseD_4c;
                    str = " _Imaginary";
                  }
                  goto switchD_00275e80_caseD_50;
                }
                str = "*";
                switch(bVar4) {
                case 0x4b:
                  str = " const";
                  break;
                case 0x4c:
                case 0x4d:
                case 0x4e:
                case 0x51:
                case 0x53:
                case 0x54:
                case 0x55:
                  goto switchD_00275e80_caseD_4c;
                case 0x4f:
                  str = "&&";
                  break;
                case 0x50:
                  break;
                case 0x52:
                  str = "&";
                  break;
                case 0x56:
                  str = " volatile";
                  break;
                default:
                  if (bVar4 == 0x72) {
                    str = " restrict";
                    break;
                  }
                  goto switchD_00275e80_caseD_4c;
                }
switchD_00275e80_caseD_50:
                MaybeAppend(state,str);
switchD_00275e80_caseD_4c:
              }
            }
            else {
              pPVar1->mangled_idx = iVar8;
              pPVar1->out_cur_idx = iVar12;
              (state->parse_state).prev_name_idx = iVar13;
              *(undefined4 *)&(state->parse_state).field_0xc = uVar14;
            }
            state->recursion_depth = state->recursion_depth + -1;
            if (bVar15) {
              *(uint *)&(state->parse_state).field_0xc =
                   *(uint *)&(state->parse_state).field_0xc & 0x8000ffff | uVar7 & 0x7fff0000;
              bVar15 = true;
              if (arity != (int *)0x0) {
                *arity = 1;
              }
              goto LAB_0027603c;
            }
          }
          else {
            state->recursion_depth = iVar6;
          }
        }
        (state->parse_state).prev_name_idx = iVar5;
        pPVar1->mangled_idx = uVar9;
        pPVar1->out_cur_idx = uVar10;
        *(uint *)&(state->parse_state).field_0xc = uVar7;
        bVar15 = ParseTwoCharToken(state,"li");
        if (bVar15) {
          MaybeAppend(state,"operator\"\" ");
          bVar16 = ParseSourceName(state);
          bVar15 = true;
          if (bVar16) goto LAB_0027603c;
        }
        (state->parse_state).prev_name_idx = iVar5;
        pPVar1->mangled_idx = uVar9;
        pPVar1->out_cur_idx = uVar10;
        *(uint *)&(state->parse_state).field_0xc = uVar7;
        bVar15 = ParseOneCharToken(state,'v');
        if (bVar15) {
          cVar3 = state->mangled_begin[(state->parse_state).mangled_idx];
          bVar15 = ParseCharClass(state,"0123456789");
          if (arity != (int *)0x0 && bVar15) {
            *arity = cVar3 + -0x30;
          }
          if (bVar15) {
            bVar16 = ParseSourceName(state);
            bVar15 = true;
            if (bVar16) goto LAB_0027603c;
          }
        }
        (state->parse_state).prev_name_idx = iVar5;
        pPVar1->mangled_idx = uVar9;
        pPVar1->out_cur_idx = uVar10;
        *(uint *)&(state->parse_state).field_0xc = uVar7;
        lVar17 = (long)(state->parse_state).mangled_idx;
        cVar3 = state->mangled_begin[lVar17];
        if (((byte)(cVar3 + 0x9fU) < 0x1a) &&
           (bVar4 = state->mangled_begin[lVar17 + 1], (byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)) {
          pcVar20 = "nw";
          puVar22 = (undefined8 *)(kOperatorList + 0x18);
          do {
            if ((cVar3 == *pcVar20) && (bVar4 == pcVar20[1])) {
              if (arity != (int *)0x0) {
                *arity = *(int *)(puVar22 + -1);
              }
              MaybeAppend(state,"operator");
              pcVar20 = (char *)puVar22[-2];
              if ((byte)(*pcVar20 + 0x9fU) < 0x1a) {
                MaybeAppend(state," ");
              }
              MaybeAppend(state,pcVar20);
              (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + 2;
              bVar15 = true;
              break;
            }
            pcVar20 = (char *)*puVar22;
            puVar22 = puVar22 + 3;
            bVar15 = pcVar20 != (char *)0x0;
          } while (bVar15);
          goto LAB_0027603c;
        }
      }
    }
  }
  bVar15 = false;
LAB_0027603c:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar15;
}

Assistant:

static bool ParseOperatorName(State *state, int *arity) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (!AtLeastNumCharsRemaining(RemainingInput(state), 2)) {
    return false;
  }
  // First check with "cv" (cast) case.
  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "cv") && MaybeAppend(state, "operator ") &&
      EnterNestedName(state) && ParseConversionOperatorType(state) &&
      LeaveNestedName(state, copy.nest_level)) {
    if (arity != nullptr) {
      *arity = 1;
    }
    return true;
  }
  state->parse_state = copy;

  // Then user-defined literals.
  if (ParseTwoCharToken(state, "li") && MaybeAppend(state, "operator\"\" ") &&
      ParseSourceName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Then vendor extended operators.
  if (ParseOneCharToken(state, 'v') && ParseDigit(state, arity) &&
      ParseSourceName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Other operator names should start with a lower alphabet followed
  // by a lower/upper alphabet.
  if (!(IsLower(RemainingInput(state)[0]) &&
        IsAlpha(RemainingInput(state)[1]))) {
    return false;
  }
  // We may want to perform a binary search if we really need speed.
  const AbbrevPair *p;
  for (p = kOperatorList; p->abbrev != nullptr; ++p) {
    if (RemainingInput(state)[0] == p->abbrev[0] &&
        RemainingInput(state)[1] == p->abbrev[1]) {
      if (arity != nullptr) {
        *arity = p->arity;
      }
      MaybeAppend(state, "operator");
      if (IsLower(*p->real_name)) {  // new, delete, etc.
        MaybeAppend(state, " ");
      }
      MaybeAppend(state, p->real_name);
      state->parse_state.mangled_idx += 2;
      UpdateHighWaterMark(state);
      return true;
    }
  }
  return false;
}